

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

void init_threads(void)

{
  int iVar1;
  char *__nptr;
  char *val;
  uint i;
  
  nthreads = 4;
  __nptr = getenv("UV_THREADPOOL_SIZE");
  if (__nptr != (char *)0x0) {
    nthreads = atoi(__nptr);
  }
  if (nthreads == 0) {
    nthreads = 1;
  }
  if (0x80 < nthreads) {
    nthreads = 0x80;
  }
  threads = default_threads;
  if ((4 < nthreads) &&
     (threads = (uv_thread_t *)uv__malloc((ulong)nthreads << 3), threads == (uv_thread_t *)0x0)) {
    nthreads = 4;
    threads = default_threads;
  }
  iVar1 = uv_cond_init(&cond);
  if (iVar1 == 0) {
    iVar1 = uv_mutex_init(&mutex);
    if (iVar1 != 0) {
      abort();
    }
    wq[0] = wq;
    wq[1] = wq;
    val._4_4_ = 0;
    while( true ) {
      if (nthreads <= val._4_4_) {
        initialized = 1;
        return;
      }
      iVar1 = uv_thread_create(threads + val._4_4_,worker,(void *)0x0);
      if (iVar1 != 0) break;
      val._4_4_ = val._4_4_ + 1;
    }
    abort();
  }
  abort();
}

Assistant:

static void init_threads(void) {
  unsigned int i;
  const char* val;

  nthreads = ARRAY_SIZE(default_threads);
  val = getenv("UV_THREADPOOL_SIZE");
  if (val != NULL)
    nthreads = atoi(val);
  if (nthreads == 0)
    nthreads = 1;
  if (nthreads > MAX_THREADPOOL_SIZE)
    nthreads = MAX_THREADPOOL_SIZE;

  threads = default_threads;
  if (nthreads > ARRAY_SIZE(default_threads)) {
    threads = uv__malloc(nthreads * sizeof(threads[0]));
    if (threads == NULL) {
      nthreads = ARRAY_SIZE(default_threads);
      threads = default_threads;
    }
  }

  if (uv_cond_init(&cond))
    abort();

  if (uv_mutex_init(&mutex))
    abort();

  QUEUE_INIT(&wq);

  for (i = 0; i < nthreads; i++)
    if (uv_thread_create(threads + i, worker, NULL))
      abort();

  initialized = 1;
}